

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hb_tree.c
# Opt level: O1

_Bool rotate_l(hb_tree *tree,hb_node *q)

{
  ulong uVar1;
  hb_node *phVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  hb_node *unaff_R12;
  hb_node *phVar8;
  
  if (((q->field_2).bal & 1U) != 0) {
    phVar8 = q->rlink;
    uVar6 = (q->field_2).bal & 0xfffffffffffffffc;
    uVar1 = (phVar8->field_2).bal;
    phVar2 = phVar8->llink;
    (q->field_2).bal = (ulong)((uVar1 & 3) == 0) | (ulong)phVar8;
    q->rlink = phVar2;
    if (phVar2 != (hb_node *)0x0) {
      (phVar2->field_2).bal = (ulong)((uint)(phVar2->field_2).bal & 3) | (ulong)q;
    }
    (phVar8->field_2).pptr = (hb_node *)(uVar6 + (ulong)((uVar1 & 3) == 0) * 2);
    phVar8->llink = q;
    if (uVar6 != 0) {
      tree = (hb_tree *)(uVar6 + 0x20);
      if (*(hb_node **)(uVar6 + 0x18) == q) {
        tree = (hb_tree *)(uVar6 + 0x18);
      }
    }
    tree->root = phVar8;
    return (uVar1 & 3) == 0;
  }
  rotate_l_cold_1();
  phVar8 = tree->root;
  do {
    if (phVar8 == (hb_node *)0x0) {
      unaff_R12 = (hb_node *)0x0;
      break;
    }
    iVar5 = (*tree->cmp_func)(q,phVar8->key);
    if (iVar5 < 0) {
      lVar7 = 0x18;
LAB_00105ae5:
      phVar8 = *(hb_node **)((long)&phVar8->key + lVar7);
      bVar3 = true;
    }
    else {
      lVar7 = 0x20;
      if (iVar5 != 0) goto LAB_00105ae5;
      bVar3 = false;
      unaff_R12 = phVar8;
    }
  } while (bVar3);
  cVar4 = (char)unaff_R12 + '\b';
  if (unaff_R12 == (hb_node *)0x0) {
    cVar4 = '\0';
  }
  return (_Bool)cVar4;
}

Assistant:

static bool
rotate_l(hb_tree* restrict const tree, hb_node* restrict const q)
{
    hb_node* restrict const qp = PARENT(q);
    hb_node* restrict const qr = q->rlink;

    ASSERT(BAL_POS(q));

    hb_node *restrict const qrl = qr->llink;
    const int qr_bal = qr->bal & BAL_MASK;

    /* q->parent <- qr; q->bal <- (qr_bal == 0); */
    q->bal = (intptr_t)qr | (qr_bal == 0);
    if ((q->rlink = qrl) != NULL)
	qrl->bal = (intptr_t)q | (qrl->bal & BAL_MASK); /* qrl->parent <- q; */

    /* qr->parent <- qp; qr->bal <- -(qr_bal == 0); */
    qr->bal = (intptr_t)qp | ((qr_bal == 0) << 1);
    qr->llink = q;
    *(qp == NULL ? &tree->root : qp->llink == q ? &qp->llink : &qp->rlink) = qr;

    return (qr_bal == 0);
}